

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

int wally_varint_to_bytes(uint64_t value,uchar *bytes_out,size_t len,size_t *written)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar1 = -2;
  if (bytes_out != (uchar *)0x0) {
    uVar3 = 1;
    if ((0xfc < value) && (uVar3 = 3, 0xffff < value)) {
      uVar3 = (ulong)(value >> 0x20 != 0) * 4 + 5;
    }
    if ((written != (size_t *)0x0) && (uVar3 <= len)) {
      if (value < 0xfd) {
        *bytes_out = (uchar)value;
        sVar2 = 1;
      }
      else if (value < 0x10000) {
        *bytes_out = 0xfd;
        *(short *)(bytes_out + 1) = (short)value;
        sVar2 = 3;
      }
      else if (value >> 0x20 == 0) {
        *bytes_out = 0xfe;
        *(int *)(bytes_out + 1) = (int)value;
        sVar2 = 5;
      }
      else {
        *bytes_out = 0xff;
        *(uint64_t *)(bytes_out + 1) = value;
        sVar2 = 9;
      }
      *written = sVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_varint_to_bytes(uint64_t value, unsigned char *bytes_out, size_t len, size_t *written)
{
    if (written)
        *written = 0;
    if (!bytes_out || len < varint_get_length(value) || !written)
        return WALLY_EINVAL;
    *written = varint_to_bytes(value, bytes_out);
    return WALLY_OK;
}